

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Expression_*> * __thiscall
wasm::WATParser::ParseDefsCtx::withLoc<wasm::Expression*>
          (Result<wasm::Expression_*> *__return_storage_ptr__,ParseDefsCtx *this,
          Result<wasm::Expression_*> *res)

{
  size_t sVar1;
  Result<wasm::Expression_*> local_48;
  Result<wasm::Expression_*> *local_20;
  Result<wasm::Expression_*> *res_local;
  ParseDefsCtx *this_local;
  
  local_20 = res;
  res_local = (Result<wasm::Expression_*> *)this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  sVar1 = Lexer::getPos(&this->in);
  Result<wasm::Expression_*>::Result(&local_48,res);
  withLoc<wasm::Expression*>(__return_storage_ptr__,this,(Index)sVar1,&local_48);
  Result<wasm::Expression_*>::~Result(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Result<T> withLoc(Result<T> res) {
    return withLoc(in.getPos(), res);
  }